

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O2

string * __thiscall
duckdb::Binder::BindCatalog(string *__return_storage_ptr__,Binder *this,string *catalog)

{
  DatabaseManager *this_00;
  optional_ptr<duckdb::AttachedDatabase,_true> oVar1;
  string *psVar2;
  
  this_00 = DatabaseManager::Get(this->context);
  oVar1 = DatabaseManager::GetDatabase(this_00,this->context,catalog);
  if (oVar1.ptr == (AttachedDatabase *)0x0) {
    psVar2 = DatabaseManager::GetDefaultDatabase_abi_cxx11_(this->context);
  }
  else {
    oVar1 = DatabaseManager::GetDatabase(this_00,this->context,catalog);
    psVar2 = &((oVar1.ptr)->super_CatalogEntry).name;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  return __return_storage_ptr__;
}

Assistant:

const string Binder::BindCatalog(string &catalog) {
	auto &db_manager = DatabaseManager::Get(context);
	optional_ptr<AttachedDatabase> database = db_manager.GetDatabase(context, catalog);
	if (database) {
		return db_manager.GetDatabase(context, catalog).get()->GetName();
	} else {
		return db_manager.GetDefaultDatabase(context);
	}
}